

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>::emplaceValue<QMakeInternal::QMakeBuiltin>
          (Node<ProKey,_QMakeInternal::QMakeBuiltin> *this,QMakeBuiltin *args)

{
  long in_FS_OFFSET;
  QMakeBuiltin local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeInternal::QMakeBuiltin::QMakeBuiltin(&local_40,args);
  QMakeInternal::QMakeBuiltin::operator=(&this->value,&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }